

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O0

bool __thiscall GoState<9U,_9U>::is_eye(GoState<9U,_9U> *this,int i,int j,int player)

{
  bool eye;
  int player_local;
  int j_local;
  int i_local;
  GoState<9U,_9U> *this_local;
  
  eye = true;
  if ((0 < i) && ((uint)this->board[i + -1][j] != player)) {
    eye = false;
  }
  if (((uint)i < 8) && ((uint)this->board[i + 1][j] != player)) {
    eye = false;
  }
  if ((0 < j) && ((uint)this->board[i][j + -1] != player)) {
    eye = false;
  }
  if (((uint)j < 8) && ((uint)this->board[i][j + 1] != player)) {
    eye = false;
  }
  return eye;
}

Assistant:

virtual bool is_eye(int i, int j, int player) const
	{
		bool eye = true;
		if (i > 0 && board[i - 1][j] != player) eye = false;
		if (i < M - 1 && board[i + 1][j] != player) eye = false;
		if (j > 0 && board[i][j - 1] != player) eye = false;
		if (j < N - 1 && board[i][j + 1] != player) eye = false;
		return eye;
	}